

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O2

void duckdb::ParquetMetaDataOperatorData::BindMetaData
               (vector<duckdb::LogicalType,_true> *return_types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names)

{
  LogicalType local_70;
  LogicalType local_58;
  LogicalType local_40;
  
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [10])"file_name");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"row_group_id");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[19]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [19])"row_group_num_rows");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[22]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [22])"row_group_num_columns");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[16]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [16])"row_group_bytes");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [10])"column_id");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])"file_offset");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[11]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [11])"num_values");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[15]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [15])"path_in_schema");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[5]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [5])0x1fb6373);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [10])"stats_min");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [10])"stats_max");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[17]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [17])"stats_null_count");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[21]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [21])"stats_distinct_count");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[16]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [16])"stats_min_value");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[16]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [16])"stats_max_value");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [12])0x2039c79);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[10]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [10])"encodings");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::VARCHAR);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[18]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [18])"index_page_offset");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [23])"dictionary_page_offset");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[17]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [17])"data_page_offset");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[22]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [22])"total_compressed_size");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[24]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [24])"total_uncompressed_size");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[19]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [19])"key_value_metadata");
  LogicalType::LogicalType(&local_58,BLOB);
  LogicalType::LogicalType(&local_70,BLOB);
  LogicalType::MAP(&local_40,&local_58,&local_70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            (&return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &local_40);
  LogicalType::~LogicalType(&local_40);
  LogicalType::~LogicalType(&local_70);
  LogicalType::~LogicalType(&local_58);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[20]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [20])"bloom_filter_offset");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[20]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [20])"bloom_filter_length");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BIGINT);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"min_is_exact");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BOOLEAN);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[13]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (char (*) [13])"max_is_exact");
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types,
             &LogicalType::BOOLEAN);
  return;
}

Assistant:

void ParquetMetaDataOperatorData::BindMetaData(vector<LogicalType> &return_types, vector<string> &names) {
	names.emplace_back("file_name");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("row_group_id");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("row_group_num_rows");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("row_group_num_columns");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("row_group_bytes");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("column_id");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("file_offset");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("num_values");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("path_in_schema");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("type");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("stats_min");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("stats_max");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("stats_null_count");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("stats_distinct_count");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("stats_min_value");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("stats_max_value");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("compression");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("encodings");
	return_types.emplace_back(LogicalType::VARCHAR);

	names.emplace_back("index_page_offset");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("dictionary_page_offset");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("data_page_offset");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("total_compressed_size");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("total_uncompressed_size");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("key_value_metadata");
	return_types.emplace_back(LogicalType::MAP(LogicalType::BLOB, LogicalType::BLOB));

	names.emplace_back("bloom_filter_offset");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("bloom_filter_length");
	return_types.emplace_back(LogicalType::BIGINT);

	names.emplace_back("min_is_exact");
	return_types.emplace_back(LogicalType::BOOLEAN);

	names.emplace_back("max_is_exact");
	return_types.emplace_back(LogicalType::BOOLEAN);
}